

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pt.hxx
# Opt level: O1

void __thiscall
P2Pt::pose_poly<double>::get_r_t_from_rhos
          (pose_poly<double> *this,uint ts_len,double (*sigmas1) [8],uint *sigmas1_len,
          double (*sigmas2) [8],double *rhos1,double *rhos2,double *gama1,double *tgt1,double *gama2
          ,double *tgt2,double *Gama1,double *Tgt1,double *Gama2,double *Tgt2,
          double (*output) [64] [4] [3],uint *output_len)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  uint uVar22;
  byte bVar23;
  bool bVar24;
  bool bVar25;
  double dVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double *pdVar30;
  double *pdVar31;
  double (*paadVar32) [4] [3];
  ulong uVar33;
  long lVar34;
  uint i;
  undefined8 *puVar35;
  double (*padVar36) [8];
  ulong uVar37;
  double (*paadVar38) [4] [3];
  double (*padVar39) [8];
  ulong uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  double dVar76;
  undefined1 auVar77 [16];
  double dVar82;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  double dVar119;
  double lambdas1 [8] [8];
  double local_4d8 [20];
  double local_438 [64];
  double local_238 [61];
  double B [3] [3];
  
  dVar26 = Gama1[1] - Gama2[1];
  auVar67._8_8_ = 0;
  auVar67._0_8_ = Gama1[2];
  auVar67 = vmovhpd_avx(auVar67,*Gama1);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = Gama2[2];
  auVar68 = vmovhpd_avx(auVar68,*Gama2);
  auVar68 = vsubpd_avx(auVar67,auVar68);
  auVar67 = vshufpd_avx(auVar68,auVar68,1);
  if (ts_len != 0) {
    dVar2 = *gama1;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = dVar2;
    dVar3 = gama1[1];
    auVar88._8_8_ = 0;
    auVar88._0_8_ = dVar3;
    dVar76 = *gama2;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = dVar76;
    dVar82 = gama2[1];
    auVar101._8_8_ = 0;
    auVar101._0_8_ = dVar82;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = gama1[2];
    dVar4 = gama2[2];
    auVar107._8_8_ = 0;
    auVar107._0_8_ = dVar4;
    pdVar30 = local_238;
    pdVar31 = local_438;
    uVar33 = 0;
    auVar27 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    padVar36 = sigmas2;
    padVar39 = sigmas1;
    do {
      uVar22 = sigmas1_len[uVar33];
      if ((ulong)uVar22 != 0) {
        dVar5 = rhos1[uVar33];
        auVar43._8_8_ = 0;
        auVar43._0_8_ = dVar5;
        dVar6 = rhos2[uVar33];
        auVar112._8_8_ = 0;
        auVar112._0_8_ = dVar6;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = dVar4 * dVar6;
        auVar28 = vfmsub231sd_fma(auVar41,auVar105,auVar43);
        auVar41 = vmulsd_avx512f(auVar107,auVar28);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = dVar6 * dVar82;
        auVar29 = vfmsub231sd_fma(auVar42,auVar88,auVar43);
        auVar42 = vmulsd_avx512f(auVar101,auVar29);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = dVar6 * dVar76;
        auVar48 = vfmsub231sd_fma(auVar44,auVar83,auVar43);
        auVar43 = vmulsd_avx512f(auVar99,auVar48);
        auVar44 = vmulsd_avx512f(auVar105,auVar28);
        auVar45 = vmulsd_avx512f(auVar112,auVar28);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = tgt2[2];
        auVar46 = vmulsd_avx512f(auVar45,auVar46);
        auVar47 = vmulsd_avx512f(auVar112,auVar29);
        auVar45._8_8_ = 0;
        auVar45._0_8_ = tgt2[1];
        auVar45 = vmulsd_avx512f(auVar47,auVar45);
        dVar119 = auVar48._0_8_;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = *tgt2;
        auVar113._8_8_ = 0;
        auVar113._0_8_ = dVar6 * dVar119;
        auVar48 = vmulsd_avx512f(auVar113,auVar48);
        auVar47._8_8_ = 0;
        auVar47._0_8_ = *Tgt2;
        auVar47 = vmulsd_avx512f(auVar67,auVar47);
        auVar49._8_8_ = 0;
        auVar49._0_8_ = Tgt2[1];
        auVar70._8_8_ = 0;
        auVar70._0_8_ = dVar26;
        auVar47 = vfmadd231sd_avx512f(auVar47,auVar70,auVar49);
        auVar50._8_8_ = 0;
        auVar50._0_8_ = Tgt2[2];
        auVar47 = vfmadd231sd_avx512f(auVar47,auVar68,auVar50);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = tgt1[2];
        auVar114._8_8_ = 0;
        auVar114._0_8_ = dVar5 * auVar28._0_8_;
        auVar49 = vmulsd_avx512f(auVar114,auVar51);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = tgt1[1];
        auVar115._8_8_ = 0;
        auVar115._0_8_ = dVar5 * auVar29._0_8_;
        auVar50 = vmulsd_avx512f(auVar115,auVar28);
        dVar6 = auVar29._0_8_ * dVar3;
        dVar5 = dVar5 * dVar119 * *tgt1;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *Tgt1;
        auVar51 = vmulsd_avx512f(auVar67,auVar29);
        dVar119 = dVar119 * dVar2;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = Tgt1[1];
        auVar51 = vfmadd231sd_avx512f(auVar51,auVar70,auVar7);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = Tgt1[2];
        auVar51 = vfmadd231sd_avx512f(auVar51,auVar68,auVar8);
        auVar52 = vpbroadcastq_avx512vl();
        auVar116._8_8_ = dVar119;
        auVar116._0_8_ = dVar119;
        auVar116._16_8_ = dVar119;
        auVar116._24_8_ = dVar119;
        auVar117._8_8_ = dVar5;
        auVar117._0_8_ = dVar5;
        auVar117._16_8_ = dVar5;
        auVar117._24_8_ = dVar5;
        auVar118._8_8_ = dVar6;
        auVar118._0_8_ = dVar6;
        auVar118._16_8_ = dVar6;
        auVar118._24_8_ = dVar6;
        auVar53 = vbroadcastsd_avx512vl(auVar50);
        auVar54 = vbroadcastsd_avx512vl(auVar44);
        auVar55 = vbroadcastsd_avx512vl(auVar49);
        auVar56 = vbroadcastsd_avx512vl(auVar51);
        auVar57 = vbroadcastsd_avx512vl(auVar43);
        auVar58 = vbroadcastsd_avx512vl(auVar48);
        auVar59 = vbroadcastsd_avx512vl(auVar42);
        auVar60 = vbroadcastsd_avx512vl(auVar45);
        auVar61 = vbroadcastsd_avx512vl(auVar41);
        auVar62 = vbroadcastsd_avx512vl(auVar46);
        auVar63 = vbroadcastsd_avx512vl(auVar47);
        uVar37 = 0;
        do {
          auVar64 = vpbroadcastq_avx512vl();
          auVar64 = vporq_avx512vl(auVar64,auVar27);
          uVar40 = vpcmpuq_avx512vl(auVar64,auVar52,2);
          uVar40 = uVar40 & 0xf;
          pdVar1 = *padVar39 + uVar37;
          bVar23 = (byte)uVar40;
          auVar64._8_8_ = (ulong)((byte)(uVar40 >> 1) & 1) * (long)pdVar1[1];
          auVar64._0_8_ = (ulong)(bVar23 & 1) * (long)*pdVar1;
          auVar64._16_8_ = (ulong)((byte)(uVar40 >> 2) & 1) * (long)pdVar1[2];
          auVar64._24_8_ = (uVar40 >> 3) * (long)pdVar1[3];
          auVar65 = vfmadd213pd_avx512vl(auVar116,auVar64,auVar117);
          auVar66 = vfmadd213pd_avx512vl(auVar118,auVar64,auVar53);
          auVar65 = vaddpd_avx512vl(auVar66,auVar65);
          auVar64 = vfmadd213pd_avx512vl(auVar64,auVar54,auVar55);
          auVar64 = vaddpd_avx512vl(auVar65,auVar64);
          auVar64 = vdivpd_avx512vl(auVar56,auVar64);
          pdVar1 = pdVar30 + uVar37;
          bVar24 = (bool)((byte)(uVar40 >> 1) & 1);
          bVar25 = (bool)((byte)(uVar40 >> 2) & 1);
          *pdVar1 = (double)((ulong)(bVar23 & 1) * auVar64._0_8_ |
                            (ulong)!(bool)(bVar23 & 1) * (long)*pdVar1);
          pdVar1[1] = (double)((ulong)bVar24 * auVar64._8_8_ | (ulong)!bVar24 * (long)pdVar1[1]);
          pdVar1[2] = (double)((ulong)bVar25 * auVar64._16_8_ | (ulong)!bVar25 * (long)pdVar1[2]);
          pdVar1[3] = (double)((uVar40 >> 3) * auVar64._24_8_ |
                              (ulong)!SUB81(uVar40 >> 3,0) * (long)pdVar1[3]);
          pdVar1 = *padVar36 + uVar37;
          auVar65._8_8_ = (ulong)((byte)(uVar40 >> 1) & 1) * (long)pdVar1[1];
          auVar65._0_8_ = (ulong)(bVar23 & 1) * (long)*pdVar1;
          auVar65._16_8_ = (ulong)((byte)(uVar40 >> 2) & 1) * (long)pdVar1[2];
          auVar65._24_8_ = (uVar40 >> 3) * (long)pdVar1[3];
          auVar64 = vfmadd213pd_avx512vl(auVar57,auVar65,auVar58);
          auVar66 = vfmadd213pd_avx512vl(auVar59,auVar65,auVar60);
          auVar64 = vaddpd_avx512vl(auVar66,auVar64);
          auVar65 = vfmadd213pd_avx512vl(auVar65,auVar61,auVar62);
          auVar64 = vaddpd_avx512vl(auVar64,auVar65);
          auVar64 = vdivpd_avx512vl(auVar63,auVar64);
          pdVar1 = pdVar31 + uVar37;
          bVar24 = (bool)((byte)(uVar40 >> 1) & 1);
          bVar25 = (bool)((byte)(uVar40 >> 2) & 1);
          *pdVar1 = (double)((ulong)(bVar23 & 1) * auVar64._0_8_ |
                            (ulong)!(bool)(bVar23 & 1) * (long)*pdVar1);
          pdVar1[1] = (double)((ulong)bVar24 * auVar64._8_8_ | (ulong)!bVar24 * (long)pdVar1[1]);
          pdVar1[2] = (double)((ulong)bVar25 * auVar64._16_8_ | (ulong)!bVar25 * (long)pdVar1[2]);
          pdVar1[3] = (double)((uVar40 >> 3) * auVar64._24_8_ |
                              (ulong)!SUB81(uVar40 >> 3,0) * (long)pdVar1[3]);
          uVar37 = uVar37 + 4;
        } while (((ulong)uVar22 + 3 & 0xfffffffffffffffc) != uVar37);
      }
      uVar33 = uVar33 + 1;
      padVar39 = padVar39 + 1;
      pdVar30 = pdVar30 + 8;
      padVar36 = padVar36 + 1;
      pdVar31 = pdVar31 + 8;
    } while (uVar33 != ts_len);
  }
  auVar83 = *(undefined1 (*) [16])Tgt2;
  auVar88 = *(undefined1 (*) [16])(Tgt1 + 1);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = Tgt2[2];
  auVar57._24_8_ = Tgt1[2];
  auVar57._16_8_ = Tgt1[2];
  dVar2 = *Tgt1;
  auVar89._8_8_ = dVar2;
  auVar89._0_8_ = dVar2;
  auVar56._16_8_ = dVar2;
  auVar56._0_16_ = auVar89;
  auVar56._24_8_ = dVar2;
  auVar27 = vpermpd_avx2(ZEXT1632(auVar83),0xc5);
  auVar99 = vunpcklpd_avx(auVar27._0_16_,auVar102);
  auVar27 = vblendpd_avx(auVar27,ZEXT1632(auVar99),3);
  auVar53 = vpermpd_avx2(ZEXT1632(auVar68),0x25);
  auVar52 = vblendpd_avx(ZEXT1632(auVar88),auVar53,0xc);
  auVar58._16_16_ = auVar88;
  auVar58._0_16_ = auVar89;
  auVar52 = vshufpd_avx(auVar58,auVar52,0xc);
  auVar54 = vpermpd_avx2(auVar52,0xc9);
  auVar55 = vpermpd_avx2(auVar27,9);
  auVar59._0_8_ = auVar55._0_8_ * auVar54._0_8_;
  auVar59._8_8_ = auVar55._8_8_ * auVar54._8_8_;
  auVar59._16_8_ = auVar55._16_8_ * auVar54._16_8_;
  auVar59._24_8_ = auVar55._24_8_ * auVar54._24_8_;
  auVar27 = vpermpd_avx2(auVar27,100);
  auVar55._8_8_ = dVar26;
  auVar55._0_8_ = dVar26;
  auVar55._16_8_ = dVar26;
  auVar55._24_8_ = dVar26;
  auVar52 = vpermi2pd_avx512vl(_DAT_00113260,auVar52,auVar55);
  auVar101 = vfnmadd213pd_fma(auVar52,auVar27,auVar59);
  auVar99 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,1);
  auVar54._0_8_ = auVar83._0_8_ * auVar68._0_8_;
  auVar54._8_8_ = auVar83._8_8_ * auVar68._8_8_;
  auVar54._16_8_ = auVar88._0_8_ * auVar68._0_8_;
  auVar54._24_8_ = auVar88._8_8_ * auVar68._8_8_;
  auVar68 = vunpcklpd_avx(auVar102,auVar83);
  auVar57._0_16_ = auVar68;
  auVar27 = vblendpd_avx(auVar57,auVar56,8);
  auVar52 = vblendpd_avx(auVar53,auVar55,6);
  vfmsub213pd_fma(auVar52,auVar27,auVar54);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = auVar83._0_8_ * 0.0;
  auVar68 = vfmadd231sd_fma(auVar69,auVar89,auVar99);
  vfmadd231sd_fma(auVar68,auVar67,auVar101);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = dVar2 * dVar26;
  vfmsub231sd_fma(auVar108,auVar88,auVar67);
  *output_len = 0;
  if (ts_len != 0) {
    uVar33 = 0;
    auVar27 = vpmovsxbq_avx2(ZEXT416(0x301800));
    do {
      if (sigmas1_len[uVar33] != 0) {
        uVar37 = 0;
        do {
          uVar22 = *output_len;
          auVar71._8_8_ = 0;
          auVar71._0_8_ = rhos1[uVar33];
          auVar77._8_8_ = 0;
          auVar77._0_8_ = *gama1;
          dVar26 = rhos2[uVar33];
          auVar84._8_8_ = 0;
          auVar84._0_8_ = dVar26;
          auVar90._8_8_ = 0;
          auVar90._0_8_ = *gama2;
          auVar100._8_8_ = 0;
          auVar100._0_8_ = *gama2 * dVar26;
          auVar67 = vfmsub231sd_fma(auVar100,auVar77,auVar71);
          local_4d8[0] = auVar67._0_8_;
          dVar2 = local_238[uVar33 * 8 + uVar37];
          dVar3 = sigmas1[uVar33][uVar37];
          auVar106._8_8_ = 0;
          auVar106._0_8_ = dVar3;
          auVar103._8_8_ = 0;
          auVar103._0_8_ = rhos1[uVar33] * *tgt1;
          auVar67 = vfmadd231sd_fma(auVar103,auVar106,auVar77);
          local_4d8[1] = auVar67._0_8_ * dVar2;
          dVar76 = local_438[uVar33 * 8 + uVar37];
          dVar82 = sigmas2[uVar33][uVar37];
          auVar109._8_8_ = 0;
          auVar109._0_8_ = dVar82;
          auVar104._8_8_ = 0;
          auVar104._0_8_ = dVar26 * *tgt2;
          auVar67 = vfmadd231sd_fma(auVar104,auVar109,auVar90);
          local_4d8[2] = auVar67._0_8_ * dVar76;
          auVar91._8_8_ = 0;
          auVar91._0_8_ = gama1[1];
          auVar110._8_8_ = 0;
          auVar110._0_8_ = gama2[1] * dVar26;
          auVar67 = vfmsub231sd_fma(auVar110,auVar91,auVar71);
          local_4d8[3] = (double)auVar67._0_8_;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = tgt1[1];
          auVar92._8_8_ = 0;
          auVar92._0_8_ = dVar3 * gama1[1];
          auVar67 = vfmadd231sd_fma(auVar92,auVar71,auVar9);
          local_4d8[4] = auVar67._0_8_ * dVar2;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = tgt2[1];
          auVar93._8_8_ = 0;
          auVar93._0_8_ = dVar82 * gama2[1];
          auVar67 = vfmadd231sd_fma(auVar93,auVar84,auVar10);
          local_4d8[5] = auVar67._0_8_ * dVar76;
          auVar94._8_8_ = 0;
          auVar94._0_8_ = gama1[2];
          paadVar38 = *output + uVar22;
          auVar111._8_8_ = 0;
          auVar111._0_8_ = gama2[2] * dVar26;
          auVar67 = vfmsub231sd_fma(auVar111,auVar94,auVar71);
          local_4d8[6] = (double)auVar67._0_8_;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = tgt1[2];
          auVar95._8_8_ = 0;
          auVar95._0_8_ = dVar3 * gama1[2];
          auVar67 = vfmadd231sd_fma(auVar95,auVar71,auVar11);
          local_4d8[7] = auVar67._0_8_ * dVar2;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = tgt2[2];
          auVar72._8_8_ = 0;
          auVar72._0_8_ = dVar82 * gama2[2];
          auVar67 = vfmadd231sd_fma(auVar72,auVar84,auVar12);
          local_4d8[8] = auVar67._0_8_ * dVar76;
          puVar35 = (undefined8 *)0x0;
          paadVar32 = paadVar38;
          do {
            dVar26 = local_4d8[(long)puVar35 * 3];
            dVar2 = local_4d8[(long)puVar35 * 3 + 1];
            dVar3 = local_4d8[(long)puVar35 * 3 + 2];
            lVar34 = 0;
            do {
              (*paadVar32)[0][lVar34] = 0.0;
              auVar52 = vpbroadcastq_avx512vl();
              auVar53 = vpbroadcastq_avx512vl();
              auVar53 = vpsllq_avx2(auVar53,3);
              auVar52 = vpaddq_avx2(auVar52,auVar53);
              vpaddq_avx2(auVar52,auVar27);
              auVar52 = vgatherqpd_avx512vl(*puVar35);
              auVar53._0_8_ = auVar52._0_8_ * dVar26;
              auVar53._8_8_ = auVar52._8_8_ * dVar2;
              auVar53._16_8_ = auVar52._16_8_ * dVar3;
              auVar53._24_8_ = 0;
              auVar52 = vblendpd_avx(auVar53,ZEXT1632(ZEXT816(0)),8);
              dVar76 = auVar52._16_8_ + auVar52._24_8_;
              dVar82 = auVar52._0_8_ + auVar52._8_8_;
              auVar78._0_8_ = dVar76 + dVar82;
              auVar78._8_8_ = dVar76 + dVar82;
              dVar76 = (double)vmovlpd_avx(auVar78);
              (*paadVar32)[0][lVar34] = dVar76;
              lVar34 = lVar34 + 1;
            } while (lVar34 != 3);
            puVar35 = (undefined8 *)((long)puVar35 + 1);
            paadVar32 = (double (*) [4] [3])(*paadVar32 + 1);
          } while (puVar35 != (undefined8 *)0x3);
          auVar73._8_8_ = 0;
          auVar73._0_8_ = *gama1;
          auVar85._8_8_ = 0;
          auVar85._0_8_ = Gama1[1];
          auVar96._8_8_ = 0;
          auVar96._0_8_ = Gama1[2];
          auVar13._8_8_ = 0;
          auVar13._0_8_ = (*paadVar38)[0][1];
          auVar79._8_8_ = 0;
          auVar79._0_8_ = *Gama1 * (*paadVar38)[0][0];
          auVar67 = vfmadd231sd_fma(auVar79,auVar85,auVar13);
          auVar14._8_8_ = 0;
          auVar14._0_8_ = (*paadVar38)[0][2];
          auVar67 = vfmadd231sd_fma(auVar67,auVar96,auVar14);
          auVar15._8_8_ = 0;
          auVar15._0_8_ = rhos1[uVar33];
          auVar67 = vfmsub231sd_fma(auVar67,auVar73,auVar15);
          (*paadVar38)[3][0] = auVar67._0_8_;
          auVar74._8_8_ = 0;
          auVar74._0_8_ = gama1[1];
          auVar86._8_8_ = 0;
          auVar86._0_8_ = Gama1[1];
          auVar97._8_8_ = 0;
          auVar97._0_8_ = Gama1[2];
          auVar16._8_8_ = 0;
          auVar16._0_8_ = (*paadVar38)[1][1];
          auVar80._8_8_ = 0;
          auVar80._0_8_ = *Gama1 * (*paadVar38)[1][0];
          auVar67 = vfmadd231sd_fma(auVar80,auVar86,auVar16);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = (*paadVar38)[1][2];
          auVar67 = vfmadd231sd_fma(auVar67,auVar97,auVar17);
          auVar18._8_8_ = 0;
          auVar18._0_8_ = rhos1[uVar33];
          auVar67 = vfmsub231sd_fma(auVar67,auVar74,auVar18);
          (*paadVar38)[3][1] = auVar67._0_8_;
          auVar75._8_8_ = 0;
          auVar75._0_8_ = gama1[2];
          auVar87._8_8_ = 0;
          auVar87._0_8_ = Gama1[1];
          auVar98._8_8_ = 0;
          auVar98._0_8_ = Gama1[2];
          auVar19._8_8_ = 0;
          auVar19._0_8_ = (*paadVar38)[2][1];
          auVar81._8_8_ = 0;
          auVar81._0_8_ = *Gama1 * (*paadVar38)[2][0];
          auVar67 = vfmadd231sd_fma(auVar81,auVar87,auVar19);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = (*paadVar38)[2][2];
          auVar67 = vfmadd231sd_fma(auVar67,auVar98,auVar20);
          auVar21._8_8_ = 0;
          auVar21._0_8_ = rhos1[uVar33];
          auVar67 = vfmsub231sd_fma(auVar67,auVar75,auVar21);
          (*paadVar38)[3][2] = auVar67._0_8_;
          uVar37 = uVar37 + 1;
          *output_len = uVar22 + 1;
        } while (uVar37 < sigmas1_len[uVar33]);
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 != ts_len);
  }
  return;
}

Assistant:

void pose_poly<T>::
get_r_t_from_rhos(
	const unsigned ts_len,
	const T sigmas1[TS_MAX_LEN][TS_MAX_LEN], const unsigned sigmas1_len[TS_MAX_LEN],
	const T sigmas2[TS_MAX_LEN][TS_MAX_LEN],
	const T rhos1[ROOT_IDS_LEN], const T rhos2[ROOT_IDS_LEN],
	const T gama1[3], const T tgt1[3],
	const T gama2[3], const T tgt2[3],
	const T Gama1[3], const T Tgt1[3],
	const T Gama2[3], const T Tgt2[3],
	T (*output)[RT_MAX_LEN][4][3], unsigned *output_len
)
{
	T lambdas1[TS_MAX_LEN][TS_MAX_LEN]; T lambdas2[TS_MAX_LEN][TS_MAX_LEN];
	const T DGama[3] = {Gama1[0]-Gama2[0], Gama1[1]-Gama2[1], Gama1[2]-Gama2[2]};
  
	for (unsigned i = 0; i < ts_len; i++) {
    const T dgamas_rhos[3] = {
     rhos1[i]*gama1[0] - rhos2[i]*gama2[0],
     rhos1[i]*gama1[1] - rhos2[i]*gama2[1],
     rhos1[i]*gama1[2] - rhos2[i]*gama2[2]};
		for (unsigned j = 0; j < sigmas1_len[i]; j++) {
			lambdas1[i][j] = 
        (DGama[0]*Tgt1[0]+DGama[1]*Tgt1[1] + DGama[2]*Tgt1[2]) / 
        (dgamas_rhos[0]*(rhos1[i]*tgt1[0] + sigmas1[i][j]*gama1[0]) + 
        dgamas_rhos[1]*(rhos1[i]*tgt1[1] + sigmas1[i][j]*gama1[1]) +
        dgamas_rhos[2]*(rhos1[i]*tgt1[2] + sigmas1[i][j]*gama1[2]));
			lambdas2[i][j] = 
        (DGama[0]*Tgt2[0]+DGama[1]*Tgt2[1] + DGama[2]*Tgt2[2]) /
        (dgamas_rhos[0]*(rhos2[i]*tgt2[0] + sigmas2[i][j]*gama2[0]) + 
        dgamas_rhos[1]*(rhos2[i]*tgt2[1] + sigmas2[i][j]*gama2[1]) +
        dgamas_rhos[2]*(rhos2[i]*tgt2[2] + sigmas2[i][j]*gama2[2]));
		}
	}

	//% Rotation:
	const T A[3][3] = {
		DGama[0], Tgt1[0], Tgt2[0],
		DGama[1], Tgt1[1], Tgt2[1],
		DGama[2], Tgt1[2], Tgt2[2]};
	T inv_A[3][3]; invm3x3(A, inv_A);

	// Matrix containing Rotations and Translations
	T (&RT)[RT_MAX_LEN][4][3] = *output;
	unsigned &RT_len               = *output_len; RT_len = 0;
	for (unsigned i = 0; i < ts_len; i++) {
		for (unsigned j = 0; j < sigmas1_len[i]; j++, RT_len++) {
			T (&Rots)[4][3] = RT[RT_len]; T (&Transls)[3] = RT[RT_len][3];

			#define B_row(r) \
				rhos1[i]*gama1[(r)] - rhos2[i]*gama2[(r)], \
				lambdas1[i][j]*(rhos1[i]*tgt1[(r)] + sigmas1[i][j]*gama1[(r)]), \
				lambdas2[i][j]*(rhos2[i]*tgt2[(r)] + sigmas2[i][j]*gama2[(r)])

			const T B[3][3] = { B_row(0), B_row(1), B_row(2) };
			multm3x3(B, inv_A, Rots);
      Transls[0] = rhos1[i]*gama1[0] - Rots[0][0] * Gama1[0] - Rots[0][1] * Gama1[1] - Rots[0][2] * Gama1[2];
      Transls[1] = rhos1[i]*gama1[1] - Rots[1][0] * Gama1[0] - Rots[1][1] * Gama1[1] - Rots[1][2] * Gama1[2];
      Transls[2] = rhos1[i]*gama1[2] - Rots[2][0] * Gama1[0] - Rots[2][1] * Gama1[1] - Rots[2][2] * Gama1[2];
		}
	}
}